

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

int __thiscall LPCMStreamReader::decodeWaveHeader(LPCMStreamReader *this,uint8_t *buff,uint8_t *end)

{
  bool bVar1;
  ostream *poVar2;
  VodCoreException *pVVar3;
  uint8_t *puVar4;
  uint8_t *local_ad0;
  int64_t fllrSize;
  string local_a10;
  ostringstream local_9f0 [8];
  ostringstream ss_5;
  string local_870;
  ostringstream local_850 [8];
  ostringstream ss_4;
  string local_6d0;
  ostringstream local_6b0 [8];
  ostringstream ss_3;
  string local_530;
  ostringstream local_510 [8];
  ostringstream ss_2;
  string local_390;
  ostringstream local_370 [8];
  ostringstream ss_1;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream ss;
  uint8_t *tmpPos;
  uint64_t fmtSize;
  WAVEFORMATPCMEX *waveFormatPCMEx;
  uint8_t *curPos;
  uint8_t *end_local;
  uint8_t *buff_local;
  LPCMStreamReader *this_local;
  
  if ((long)end - (long)buff < 0x14) {
    return -10;
  }
  if (this->m_headerType == htWAVE64) {
    waveFormatPCMEx = (WAVEFORMATPCMEX *)findSubstr(anon_var_dwarf_c2696 + 0xc,buff,end);
    if ((waveFormatPCMEx == (WAVEFORMATPCMEX *)0x0) || (end <= &waveFormatPCMEx->SubFormat)) {
      return -10;
    }
    tmpPos = *(uint8_t **)&waveFormatPCMEx->cbSize;
    if (end <= tmpPos + (long)(&waveFormatPCMEx->SubFormat + -2) + 8) {
      return -10;
    }
    fmtSize = (uint64_t)&waveFormatPCMEx->SubFormat;
  }
  else {
    puVar4 = findSubstr(anon_var_dwarf_c2696 + 0xc,buff,end);
    if ((puVar4 == (uint8_t *)0x0) || (end <= puVar4 + 8)) {
      return -10;
    }
    tmpPos = (uint8_t *)(ulong)*(uint *)(puVar4 + 4);
    if (end <= puVar4 + 8 + (long)tmpPos) {
      return -10;
    }
    fmtSize = (uint64_t)(puVar4 + 8);
    waveFormatPCMEx = (WAVEFORMATPCMEX *)fmtSize;
  }
  this->m_channels = (uint8_t)*(undefined2 *)(fmtSize + 2);
  if (8 < this->m_channels) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"Too many channels: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->m_channels);
    std::operator<<(poVar2,". Maximum supported value is 8(7.1)");
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,3,&local_1f0);
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (this->m_channels == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_370);
    std::operator<<((ostream *)local_370,"Invalid channels count: 0. WAVE header is invalid.");
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,3,&local_390);
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_freq = *(int32_t *)(fmtSize + 4);
  if (((this->m_freq != 48000) && (this->m_freq != 96000)) && (this->m_freq != 0x2ee00)) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    poVar2 = std::operator<<((ostream *)local_510,"Sample rate ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_freq);
    std::operator<<(poVar2," is not supported for LPCM format. Allowed values: 48000, 96000, 192000"
                   );
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,3,&local_530);
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_bitsPerSample = *(uint16_t *)(fmtSize + 0xe);
  if (((this->m_bitsPerSample != 0x10) && (this->m_bitsPerSample != 0x14)) &&
     (this->m_bitsPerSample != 0x18)) {
    std::__cxx11::ostringstream::ostringstream(local_6b0);
    poVar2 = std::operator<<((ostream *)local_6b0,"Bit depth ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bitsPerSample);
    std::operator<<(poVar2," is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit")
    ;
    pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar3,3,&local_6d0);
    __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_lfeExists = false;
  if (*(short *)fmtSize == -2) {
    if (*(short *)(fmtSize + 0x12) != 0) {
      this->m_bitsPerSample = *(uint16_t *)(fmtSize + 0x12);
    }
    this->m_lfeExists = (*(uint *)(fmtSize + 0x14) & 8) != 0;
    bVar1 = wave_format::GUID::operator==
                      ((GUID *)(fmtSize + 0x18),(GUID *)&wave_format::KSDATAFORMAT_SUBTYPE_PCM);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_850);
      std::operator<<((ostream *)local_850,"Unsupported WAVE format. Only PCM audio is supported.");
      pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar3,3,&local_870);
      __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
  }
  else {
    if (*(short *)fmtSize != 1) {
      std::__cxx11::ostringstream::ostringstream(local_9f0);
      poVar2 = std::operator<<((ostream *)local_9f0,"Unsupported WAVE format. wFormatTag: ");
      std::ostream::operator<<(poVar2,*(ushort *)fmtSize);
      pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar3,3,&local_a10);
      __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (2 < this->m_channels) {
      if (this->m_channels == '\x03') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R LFE"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this->m_lfeExists = true;
      }
      else if (this->m_channels == '\x04') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R BL BR"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (this->m_channels == '\x05') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R C BL BR"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (this->m_channels == '\x06') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R C LFE BL BR"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this->m_lfeExists = true;
      }
      else if (this->m_channels == '\a') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R C BL BR SL SR"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (this->m_channels == '\b') {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! Multi channels WAVE file for stream ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar2 = std::operator<<(poVar2,
                                 " do not contain channels configuration info. Applying default value: L R C LFE BL BR SL SR"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this->m_lfeExists = true;
      }
    }
  }
  waveFormatPCMEx = (WAVEFORMATPCMEX *)(tmpPos + (long)waveFormatPCMEx);
  if ((((uint8_t)waveFormatPCMEx->wFormatTag == 'F') &&
      (*(uint8_t *)((long)&waveFormatPCMEx->wFormatTag + 1) == 'L')) &&
     (((char)waveFormatPCMEx->nChannels == 'L' &&
      (*(char *)((long)&waveFormatPCMEx->nChannels + 1) == 'R')))) {
    if ((long)end - (long)&waveFormatPCMEx->nAvgBytesPerSec <
        *(long *)&waveFormatPCMEx->nSamplesPerSec) {
      return -10;
    }
    waveFormatPCMEx =
         (WAVEFORMATPCMEX *)
         (*(long *)&waveFormatPCMEx->nSamplesPerSec + (long)&waveFormatPCMEx->nAvgBytesPerSec);
  }
  local_ad0 = end;
  if (waveFormatPCMEx[4].SubFormat.data4 <= end) {
    local_ad0 = waveFormatPCMEx[4].SubFormat.data4;
  }
  puVar4 = findSubstr("data",(uint8_t *)waveFormatPCMEx,local_ad0);
  if (puVar4 == (uint8_t *)0x0) {
    this_local._4_4_ = 0;
    if (end < (uint8_t *)0xc0) {
      this_local._4_4_ = -10;
    }
  }
  else {
    if (this->m_headerType == htWAVE) {
      if (end <= puVar4 + 8) {
        return -10;
      }
      this->m_curChunkLen = (ulong)*(uint *)(puVar4 + 4);
      if (this->m_curChunkLen == 0) {
        this->m_openSizeWaveFormat = true;
      }
      waveFormatPCMEx._0_4_ = (int)puVar4 + 8;
    }
    else {
      if (end <= puVar4 + 0x18) {
        return -10;
      }
      this->m_curChunkLen = *(long *)(puVar4 + 0x10) + -0x18;
      waveFormatPCMEx._0_4_ = (int)puVar4 + 0x18;
    }
    this_local._4_4_ = (int)waveFormatPCMEx - (int)buff;
  }
  return this_local._4_4_;
}

Assistant:

int LPCMStreamReader::decodeWaveHeader(uint8_t* buff, uint8_t* end)
{
    if (end - buff < 20)
        return NOT_ENOUGH_BUFFER;
    uint8_t* curPos = buff;
    // if (m_channels == 0)
    {
        WAVEFORMATPCMEX* waveFormatPCMEx;
        uint64_t fmtSize;
        if (m_headerType == LPCMHeaderType::htWAVE64)
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + sizeof(GUID) + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            uint8_t* tmpPos = curPos + sizeof(GUID);
            fmtSize = *reinterpret_cast<uint64_t*>(tmpPos);
            if (curPos + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(tmpPos + 8);
        }
        else
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            fmtSize = *reinterpret_cast<uint32_t*>(curPos + 4);
            if (curPos + 8 + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            curPos += 8;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(curPos);
        }

        m_channels = static_cast<uint8_t>(waveFormatPCMEx->nChannels);
        if (m_channels > 8)
            THROW(ERR_COMMON,
                  "Too many channels: " << static_cast<int>(m_channels) << ". Maximum supported value is 8(7.1)")
        if (m_channels == 0)
            THROW(ERR_COMMON, "Invalid channels count: 0. WAVE header is invalid.")
        m_freq = waveFormatPCMEx->nSamplesPerSec;
        if (m_freq != 48000 && m_freq != 96000 && m_freq != 192000)
            THROW(ERR_COMMON,
                  "Sample rate " << m_freq << " is not supported for LPCM format. Allowed values: 48000, 96000, 192000")
        m_bitsPerSample = waveFormatPCMEx->wBitsPerSample;
        if (m_bitsPerSample != 16 && m_bitsPerSample != 20 && m_bitsPerSample != 24)
            THROW(ERR_COMMON, "Bit depth " << m_bitsPerSample
                                           << " is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit")
        m_lfeExists = false;
        if (waveFormatPCMEx->wFormatTag == WAVE_FORMAT_EXTENSIBLE)
        {
            if (waveFormatPCMEx->Samples.wValidBitsPerSample)
                m_bitsPerSample = waveFormatPCMEx->Samples.wValidBitsPerSample;
            m_lfeExists = waveFormatPCMEx->dwChannelMask & SPEAKER_LOW_FREQUENCY;
            if (!(waveFormatPCMEx->SubFormat == KSDATAFORMAT_SUBTYPE_PCM))
                THROW(ERR_COMMON, "Unsupported WAVE format. Only PCM audio is supported.")
        }
        else if (waveFormatPCMEx->wFormatTag == 0x01)
        {  // standard format
            if (m_channels > 2)
            {
                if (m_channels == 3)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R LFE");
                    m_lfeExists = true;
                }
                else if (m_channels == 4)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R BL BR");
                }
                else if (m_channels == 5)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR");
                }
                else if (m_channels == 6)
                {
                    LTRACE(
                        LT_WARN, 2,
                        "Warning! Multi channels WAVE file for stream "
                            << m_streamIndex
                            << " do not contain channels configuration info. Applying default value: L R C LFE BL BR");
                    m_lfeExists = true;
                }
                else if (m_channels == 7)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR SL "
                                  "SR");
                }
                else if (m_channels == 8)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C LFE BL "
                                  "BR SL SR");
                    m_lfeExists = true;
                }
            }
        }
        else
            THROW(ERR_COMMON, "Unsupported WAVE format. wFormatTag: " << waveFormatPCMEx->wFormatTag)
        curPos += fmtSize;
    }

    // in case there is a 'FLLR' (IPhone filler), skip it
    if (curPos[0] == 'F' && curPos[1] == 'L' && curPos[2] == 'L' && curPos[3] == 'R')
    {
        curPos += 4;
        int64_t fllrSize = *reinterpret_cast<int64_t*>(curPos);
        curPos += 4;
        if (end - curPos < fllrSize)
            return NOT_ENOUGH_BUFFER;
        curPos += fllrSize;
    }

    curPos = findSubstr("data", curPos, FFMIN(curPos + MAX_HEADER_SIZE, end));
    if (curPos == nullptr)
    {
        return end < curPos + MAX_HEADER_SIZE ? NOT_ENOUGH_BUFFER : 0;
        // 'riff' header was wrong detected, it is just data
    }

    if (m_headerType == LPCMHeaderType::htWAVE)
    {
        if (curPos + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += 4;  // skip 'data' identifier
        m_curChunkLen = *reinterpret_cast<uint32_t*>(curPos);
        if (m_curChunkLen == 0)
            m_openSizeWaveFormat = true;
        curPos += 4;
    }
    else
    {
        if (curPos + sizeof(GUID) + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += sizeof(GUID);
        // For w64, data length includes data metadata (16 bytes) and size (8 bytes)
        m_curChunkLen = *reinterpret_cast<int64_t*>(curPos) - 24;
        curPos += 8;
    }
    return static_cast<int>(curPos - buff);
}